

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream_reader.cpp
# Opt level: O3

string * unpack_from<std::__cxx11::string>(string *__return_storage_ptr__,BitstreamReader *bitpack)

{
  uint32_t uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    uVar1 = BitstreamReader::read_variable_length_number(bitpack);
    if ((char)uVar1 == '\0') break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,(char)uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string unpack_from<std::string>(BitstreamReader& bitpack)
{
    std::string str;
    char character;
    while(true) {
        character = (char)bitpack.read_variable_length_number();
        if(character == '\0')
            return str;

        str.push_back(character);
    }
}